

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>::
emplace_back<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>
          (SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
           *this,variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *args)

{
  iterator pvVar1;
  undefined8 *in_RSI;
  SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
  *in_RDI;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
  *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>::
    end(in_RDI);
    local_8 = emplaceRealloc<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pvVar1 = SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
             ::end(in_RDI);
    (pvVar1->super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
    super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
    super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
    super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
    super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
    super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>._M_u
         = (_Variadic_union<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>)*in_RSI;
    *(undefined8 *)
     &(pvVar1->super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
      super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
      super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
      super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
      super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
      super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
      _M_index = in_RSI[1];
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
              ::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }